

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool_extension.cpp
# Opt level: O2

uint64 __thiscall
dlib::thread_pool_implementation::add_task_internal
          (thread_pool_implementation *this,bfp_type *bfp,
          shared_ptr<dlib::thread_pool_implementation::function_object_copy> *item)

{
  long lVar1;
  size_t sVar2;
  task_state_type *ptVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  bool bVar6;
  bfp_type *id;
  long lVar7;
  uint64 uVar8;
  bfp_type *pbVar9;
  auto_mutex M;
  
  M.m = &this->m;
  M.r = (rmutex *)0x0;
  M.rw = (read_write_mutex *)0x0;
  pbVar9 = bfp;
  pthread_mutex_lock((pthread_mutex_t *)M.m);
  id = (bfp_type *)pthread_self();
  lVar7 = find_empty_task_slot(this);
  if (lVar7 == -1) {
    pbVar9 = id;
    bVar6 = is_worker_thread(this,(thread_id_type)id);
    if (bVar6) {
      auto_mutex::unlock(&M);
      (**(code **)(*(bfp->bf_memory).data + 0x10))();
      uVar8 = 1;
      goto LAB_00185d60;
    }
  }
  while (lVar7 == -1) {
    signaler::wait(&this->task_done_signaler,pbVar9);
    lVar7 = find_empty_task_slot(this);
  }
  pbVar9 = &(this->tasks).array_elements[lVar7].bfp;
  *(bfp_type **)((long)(pbVar9 + -2) + 0x40) = id;
  lVar1 = *(long *)((long)(pbVar9 + -2) + 0x48);
  sVar2 = (this->tasks).array_size;
  *(long *)((long)(pbVar9 + -2) + 0x48) = lVar1 + 1;
  *(size_t *)((long)(pbVar9 + -2) + 0x38) = sVar2 * lVar1 + lVar7;
  bound_function_pointer::operator=(pbVar9,bfp);
  ptVar3 = (this->tasks).array_elements;
  peVar4 = ptVar3[lVar7].function_copy.
           super___shared_ptr<dlib::thread_pool_implementation::function_object_copy,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  ptVar3[lVar7].function_copy.
  super___shared_ptr<dlib::thread_pool_implementation::function_object_copy,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (item->
            super___shared_ptr<dlib::thread_pool_implementation::function_object_copy,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  (item->
  super___shared_ptr<dlib::thread_pool_implementation::function_object_copy,_(__gnu_cxx::_Lock_policy)2>
  )._M_ptr = peVar4;
  p_Var5 = (item->
           super___shared_ptr<dlib::thread_pool_implementation::function_object_copy,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (item->
  super___shared_ptr<dlib::thread_pool_implementation::function_object_copy,_(__gnu_cxx::_Lock_policy)2>
  )._M_refcount._M_pi =
       ptVar3[lVar7].function_copy.
       super___shared_ptr<dlib::thread_pool_implementation::function_object_copy,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  ptVar3[lVar7].function_copy.
  super___shared_ptr<dlib::thread_pool_implementation::function_object_copy,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var5;
  pthread_cond_signal((pthread_cond_t *)&(this->task_ready_signaler).cond);
  uVar8 = (this->tasks).array_elements[lVar7].task_id;
LAB_00185d60:
  auto_mutex::~auto_mutex(&M);
  return uVar8;
}

Assistant:

uint64 thread_pool_implementation::
    add_task_internal (
        const bfp_type& bfp,
        std::shared_ptr<function_object_copy>& item
    )
    {
        auto_mutex M(m);
        const thread_id_type my_thread_id = get_thread_id();

        // find a thread that isn't doing anything
        long idx = find_empty_task_slot();
        if (idx == -1 && is_worker_thread(my_thread_id))
        {
            // this function is being called from within a worker thread and there
            // aren't any other worker threads free so just perform the task right
            // here

            M.unlock();
            bfp();

            // return a task id that is both non-zero and also one
            // that is never normally returned.  This way calls
            // to wait_for_task() will never block given this id.
            return 1;
        }

        // wait until there is a thread that isn't doing anything
        while (idx == -1)
        {
            task_done_signaler.wait();
            idx = find_empty_task_slot();
        }

        tasks[idx].thread_id = my_thread_id;
        tasks[idx].task_id = make_next_task_id(idx);
        tasks[idx].bfp = bfp;
        tasks[idx].function_copy.swap(item);

        task_ready_signaler.signal();

        return tasks[idx].task_id;
    }